

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_> * __thiscall
tinyusdz::prim::(anonymous_namespace)::
ConvertToAnimatable<std::vector<double,std::allocator<double>>>
          (optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,PrimVar *var)

{
  double t;
  bool bVar1;
  TimeSamples *pTVar2;
  Sample *pSVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_00;
  value_type *pvVar4;
  optional<std::vector<double,_std::allocator<double>_>_> local_f8;
  undefined1 local_d8 [8];
  optional<std::vector<double,_std::allocator<double>_>_> pv_1;
  Sample *s;
  size_t i;
  undefined1 local_88 [8];
  optional<std::vector<double,_std::allocator<double>_>_> pv;
  bool ok;
  undefined1 local_58 [8];
  Animatable<std::vector<double,_std::allocator<double>_>_> dst;
  PrimVar *var_local;
  
  dst._ts._24_8_ = this;
  Animatable<std::vector<double,_std::allocator<double>_>_>::Animatable
            ((Animatable<std::vector<double,_std::allocator<double>_>_> *)local_58);
  bVar1 = primvar::PrimVar::is_valid((PrimVar *)dst._ts._24_8_);
  if (bVar1) {
    pv.contained._23_1_ = 0;
    bVar1 = primvar::PrimVar::has_value((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      primvar::PrimVar::get_value<std::vector<double,std::allocator<double>>>
                ((optional<std::vector<double,_std::allocator<double>_>_> *)&i,
                 (PrimVar *)dst._ts._24_8_);
      nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::
      optional<std::vector<double,_std::allocator<double>_>,_0>
                ((optional<std::vector<double,_std::allocator<double>_>_> *)local_88,
                 (optional<std::vector<double,_std::allocator<double>_>_> *)&i);
      nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
                ((optional<std::vector<double,_std::allocator<double>_>_> *)&i);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_88);
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::
                 value((optional<std::vector<double,_std::allocator<double>_>_> *)local_88);
        Animatable<std::vector<double,_std::allocator<double>_>_>::set_default
                  ((Animatable<std::vector<double,_std::allocator<double>_>_> *)local_58,pvVar4);
        pv.contained._23_1_ = 1;
      }
      nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
                ((optional<std::vector<double,_std::allocator<double>_>_> *)local_88);
    }
    bVar1 = primvar::PrimVar::has_timesamples((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      s = (Sample *)0x0;
      while( true ) {
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        pSVar3 = (Sample *)tinyusdz::value::TimeSamples::size(pTVar2);
        if (pSVar3 <= s) break;
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        this_00 = tinyusdz::value::TimeSamples::get_samples(pTVar2);
        pv_1.contained._16_8_ =
             ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[](this_00,(size_type)s);
        if ((((const_reference)pv_1.contained._16_8_)->blocked & 1U) == 0) {
          tinyusdz::value::Value::get_value<std::vector<double,std::allocator<double>>>
                    (&local_f8,&((const_reference)pv_1.contained._16_8_)->value,false);
          nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::
          optional<std::vector<double,_std::allocator<double>_>,_0>
                    ((optional<std::vector<double,_std::allocator<double>_>_> *)local_d8,&local_f8);
          nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
                    (&local_f8);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_d8);
          if (bVar1) {
            t = *(double *)pv_1.contained._16_8_;
            pvVar4 = nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>
                     ::value((optional<std::vector<double,_std::allocator<double>_>_> *)local_d8);
            Animatable<std::vector<double,_std::allocator<double>_>_>::add_sample
                      ((Animatable<std::vector<double,_std::allocator<double>_>_> *)local_58,t,
                       pvVar4);
          }
          else {
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>::optional
                      (__return_storage_ptr__);
          }
          nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
                    ((optional<std::vector<double,_std::allocator<double>_>_> *)local_d8);
          if (!bVar1) goto LAB_002f515f;
        }
        else {
          Animatable<std::vector<double,_std::allocator<double>_>_>::add_blocked_sample
                    ((Animatable<std::vector<double,_std::allocator<double>_>_> *)local_58,
                     ((const_reference)pv_1.contained._16_8_)->t);
        }
        s = (Sample *)((long)&s->t + 1);
      }
      pv.contained._23_1_ = 1;
    }
    if ((pv.contained._23_1_ & 1) == 0) {
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>::optional
                (__return_storage_ptr__);
    }
    else {
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>::
      optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>,_0>
                (__return_storage_ptr__,
                 (Animatable<std::vector<double,_std::allocator<double>_>_> *)local_58);
    }
  }
  else {
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_>::optional
              (__return_storage_ptr__);
  }
LAB_002f515f:
  Animatable<std::vector<double,_std::allocator<double>_>_>::~Animatable
            ((Animatable<std::vector<double,_std::allocator<double>_>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}